

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  ArrayPtr<const_capnp::word> segment_00;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *this_00;
  uint key;
  bool bVar1;
  int iVar2;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_> *pMVar3;
  undefined4 extraout_var;
  Own<capnp::_::SegmentReader,_std::nullptr_t> *other;
  word *extraout_RDX;
  Own<capnp::_::SegmentReader,_std::nullptr_t> local_110;
  SegmentReader *local_100;
  SegmentReader *result;
  word *local_f0;
  ReaderArena *local_e8;
  undefined1 local_e0 [8];
  Own<capnp::_::SegmentReader,_std::nullptr_t> segment;
  SegmentWordCount local_ac;
  undefined1 auStack_a8 [4];
  SegmentWordCount newSegmentSize;
  ArrayPtr<const_capnp::word> newSegment;
  Own<capnp::_::SegmentReader,_std::nullptr_t> *segment_1;
  Own<capnp::_::SegmentReader,_std::nullptr_t> *local_80;
  Own<capnp::_::SegmentReader,_std::nullptr_t> *_segment127;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *s;
  Own<capnp::_::SegmentReader,_std::nullptr_t> *local_60;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *_s126;
  SegmentMap *segments;
  undefined1 local_48 [8];
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  lock;
  Id<unsigned_int,_capnp::_::Segment> local_24 [3];
  ReaderArena *this_local;
  undefined8 uStack_10;
  SegmentId id_local;
  
  local_24._4_8_ = this;
  this_local._4_4_ = id.value;
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(local_24,0);
  bVar1 = kj::Id<unsigned_int,_capnp::_::Segment>::operator==
                    ((Id<unsigned_int,_capnp::_::Segment> *)((long)&this_local + 4),local_24);
  if (bVar1) {
    join_0x00000010_0x00000000_ = SegmentReader::getArray(&this->segment0);
    bVar1 = kj::ArrayPtr<const_capnp::word>::operator==
                      ((ArrayPtr<const_capnp::word> *)&lock.ptr,(void *)0x0);
    if (!bVar1) {
      return &this->segment0;
    }
    return (SegmentReader *)0x0;
  }
  kj::
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  ::lockExclusive((MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
                   *)local_48,&this->moreSegments);
  _s126 = (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *)0x0;
  pMVar3 = kj::
           Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
           ::operator*((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
                        *)local_48);
  local_60 = (Own<capnp::_::SegmentReader,_std::nullptr_t> *)
             kj::_::
             readMaybe<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>>
                       (pMVar3);
  if (local_60 != (Own<capnp::_::SegmentReader,_std::nullptr_t> *)0x0) {
    _segment127 = local_60;
    kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::
    find<unsigned_int&>((HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>> *)
                        &segment_1,(uint *)local_60);
    local_80 = kj::_::readMaybe<kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>
                         ((Maybe<kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_&> *)&segment_1);
    if (local_80 != (Own<capnp::_::SegmentReader,_std::nullptr_t> *)0x0) {
      uStack_10 = kj::Own::operator_cast_to_SegmentReader_((Own *)local_80);
      newSegment.size_._4_4_ = 1;
      goto LAB_0030bb05;
    }
    _s126 = (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *)_segment127;
  }
  iVar2 = (*this->message->_vptr_MessageReader[2])(this->message,(ulong)this_local._4_4_);
  _auStack_a8 = (word *)CONCAT44(extraout_var,iVar2);
  newSegment.ptr = extraout_RDX;
  bVar1 = kj::ArrayPtr<const_capnp::word>::operator==
                    ((ArrayPtr<const_capnp::word> *)auStack_a8,(void *)0x0);
  if (bVar1) {
    uStack_10 = (SegmentReader *)0x0;
    newSegment.size_._4_4_ = 1;
  }
  else {
    segment_00.size_ = (size_t)newSegment.ptr;
    segment_00.ptr = _auStack_a8;
    local_ac = verifySegment(segment_00);
    pMVar3 = kj::
             Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
             ::operator*((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
                          *)local_48);
    bVar1 = kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>
            ::operator==(pMVar3);
    if (bVar1) {
      pMVar3 = kj::
               Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
               ::operator->((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
                             *)local_48);
      _s126 = kj::
              Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>::
              emplace<>(pMVar3);
    }
    local_e8 = this;
    local_f0 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_a8);
    result = (SegmentReader *)&this->readLimiter;
    kj::
    heap<capnp::_::SegmentReader,capnp::_::ReaderArena*,kj::Id<unsigned_int,capnp::_::Segment>&,capnp::word_const*,unsigned_int&,capnp::_::ReadLimiter*>
              ((kj *)local_e0,&local_e8,
               (Id<unsigned_int,_capnp::_::Segment> *)((long)&this_local + 4),&local_f0,&local_ac,
               (ReadLimiter **)&result);
    local_100 = kj::Own::operator_cast_to_SegmentReader_((Own *)local_e0);
    key = this_local._4_4_;
    this_00 = _s126;
    other = kj::mv<kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>
                      ((Own<capnp::_::SegmentReader,_std::nullptr_t> *)local_e0);
    kj::Own<capnp::_::SegmentReader,_std::nullptr_t>::Own(&local_110,other);
    kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>::insert
              (this_00,key,&local_110);
    kj::Own<capnp::_::SegmentReader,_std::nullptr_t>::~Own(&local_110);
    uStack_10 = local_100;
    newSegment.size_._4_4_ = 1;
    kj::Own<capnp::_::SegmentReader,_std::nullptr_t>::~Own
              ((Own<capnp::_::SegmentReader,_std::nullptr_t> *)local_e0);
  }
LAB_0030bb05:
  kj::
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  ::~Locked((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
             *)local_48);
  return (SegmentReader *)uStack_10;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_SOME(s, *lock) {
    KJ_IF_SOME(segment, s.find(id.value)) {
      return segment;
    }
    segments = &s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegment(newSegment);

  if (*lock == kj::none) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}